

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

PFFFT_Setup * pffft_new_setup(int N,pffft_transform_t transform)

{
  int iVar1;
  uint uVar2;
  int n;
  int iVar3;
  int iVar4;
  PFFFT_Setup *s;
  v4sf *pafVar5;
  v4sf *wa;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double local_a8;
  int local_a0;
  
  s = (PFFFT_Setup *)malloc(0x60);
  if (transform == PFFFT_REAL) {
    if ((N < 1) || ((N & 0x1fU) != 0)) {
      __assert_fail("(N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                    ,0x4c0,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
    }
  }
  else if ((transform == PFFFT_COMPLEX) && ((N < 1 || ((N & 0xfU) != 0)))) {
    __assert_fail("(N%(SIMD_SZ*SIMD_SZ))==0 && N>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x4c1,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
  }
  s->N = N;
  s->transform = transform;
  iVar13 = N / 2;
  if (transform != PFFFT_REAL) {
    iVar13 = N;
  }
  uVar2 = iVar13 / 4;
  s->Ncvec = uVar2;
  pafVar5 = (v4sf *)pffft_aligned_malloc((long)(int)(uVar2 * 2) << 4);
  wa = pafVar5 + (int)(uVar2 * 6) / 4;
  uVar7 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  s->data = pafVar5;
  s->e = (float *)pafVar5;
  s->twiddle = *wa;
  if (transform == PFFFT_REAL) {
    uVar6 = 0;
    local_a8 = 0.0;
    for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
      lVar16 = ((ulong)(uVar7 & 3) << 0x20) + (uVar6 >> 2) * 0x1800000000;
      iVar13 = 1;
      for (lVar10 = 0; lVar10 != 0x60; lVar10 = lVar10 + 0x20) {
        dVar17 = (double)(float)(((double)iVar13 * -6.283185307179586 * local_a8) / (double)N);
        dVar18 = cos(dVar17);
        *(float *)((long)pafVar5[(uVar6 >> 2) * 6] + lVar10 + (ulong)(uVar7 & 3) * 4) =
             (float)dVar18;
        dVar17 = sin(dVar17);
        *(float *)((long)pafVar5[1] + (lVar16 >> 0x1e)) = (float)dVar17;
        lVar16 = lVar16 + 0x800000000;
        iVar13 = iVar13 + 1;
      }
      local_a8 = local_a8 + 1.0;
      uVar6 = uVar6 + 1;
    }
    n = N / 4;
    iVar3 = decompose(n,s->ifac,(int *)rffti1_ps_ntryh);
    lVar10 = 1;
    lVar16 = 0;
    local_a0 = 1;
    iVar13 = local_a0;
    while (local_a0 = iVar13, lVar10 < iVar3) {
      iVar1 = s->ifac[lVar10 + 1];
      lVar10 = lVar10 + 1;
      iVar13 = iVar1 * local_a0;
      iVar4 = n / iVar13;
      lVar16 = (long)(int)lVar16;
      pfVar11 = *wa + lVar16;
      iVar12 = 0;
      for (iVar14 = 1; iVar14 < iVar1; iVar14 = iVar14 + 1) {
        iVar12 = iVar12 + local_a0;
        iVar15 = 1;
        for (lVar9 = 1; (int)lVar9 + 2 <= iVar4; lVar9 = lVar9 + 2) {
          dVar17 = (double)((float)iVar15 * (float)iVar12 * (6.2831855 / (float)n));
          dVar18 = cos(dVar17);
          pfVar11[lVar9 + -1] = (float)dVar18;
          dVar17 = sin(dVar17);
          pfVar11[lVar9] = (float)dVar17;
          iVar15 = iVar15 + 1;
        }
        lVar16 = lVar16 + iVar4;
        pfVar11 = pfVar11 + iVar4;
      }
    }
  }
  else {
    local_a8 = 0.0;
    uVar6 = 0;
    for (; uVar7 != uVar2; uVar7 = uVar7 + 1) {
      lVar16 = ((ulong)(uVar7 & 3) << 0x20) + (uVar6 >> 2) * 0x1800000000;
      iVar13 = 1;
      for (lVar10 = 0; lVar10 != 0x60; lVar10 = lVar10 + 0x20) {
        dVar17 = (double)(float)(((double)iVar13 * -6.283185307179586 * local_a8) / (double)N);
        dVar18 = cos(dVar17);
        *(float *)((long)pafVar5[(uVar6 >> 2) * 6] + lVar10 + (ulong)(uVar7 & 3) * 4) =
             (float)dVar18;
        dVar17 = sin(dVar17);
        *(float *)((long)pafVar5[1] + (lVar16 >> 0x1e)) = (float)dVar17;
        lVar16 = lVar16 + 0x800000000;
        iVar13 = iVar13 + 1;
      }
      local_a8 = local_a8 + 1.0;
      uVar6 = uVar6 + 1;
    }
    cffti1_ps(N / 4,*wa,s->ifac);
  }
  uVar8 = 0;
  uVar6 = (ulong)(uint)s->ifac[1];
  if (s->ifac[1] < 1) {
    uVar6 = uVar8;
  }
  iVar13 = 1;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    iVar13 = iVar13 * s->ifac[uVar8 + 2];
  }
  if (iVar13 != N / 4) {
    pffft_destroy_setup(s);
    s = (PFFFT_Setup *)0x0;
  }
  return s;
}

Assistant:

PFFFT_Setup *pffft_new_setup(int N, pffft_transform_t transform) {
  PFFFT_Setup *s = (PFFFT_Setup*)malloc(sizeof(PFFFT_Setup));
  int k, m;
  /* unfortunately, the fft size must be a multiple of 16 for complex FFTs 
     and 32 for real FFTs -- a lot of stuff would need to be rewritten to
     handle other cases (or maybe just switch to a scalar fft, I don't know..) */
  if (transform == PFFFT_REAL) { assert((N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0); }
  if (transform == PFFFT_COMPLEX) { assert((N%(SIMD_SZ*SIMD_SZ))==0 && N>0); }
  //assert((N % 32) == 0);
  s->N = N;
  s->transform = transform;  
  /* nb of complex simd vectors */
  s->Ncvec = (transform == PFFFT_REAL ? N/2 : N)/SIMD_SZ;
  s->data = (v4sf*)pffft_aligned_malloc(2*s->Ncvec * sizeof(v4sf));
  s->e = (float*)s->data;
  s->twiddle = (float*)(s->data + (2*s->Ncvec*(SIMD_SZ-1))/SIMD_SZ);  

  if (transform == PFFFT_REAL) {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0) * SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1) * SIMD_SZ + j] = sin(A);
      }
    }
    rffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  } else {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0)*SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1)*SIMD_SZ + j] = sin(A);
      }
    }
    cffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  }

  /* check that N is decomposable with allowed prime factors */
  for (k=0, m=1; k < s->ifac[1]; ++k) { m *= s->ifac[2+k]; }
  if (m != N/SIMD_SZ) {
    pffft_destroy_setup(s); s = 0;
  }

  return s;
}